

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

bool __thiscall
QFileDialogPrivate::restoreWidgetState
          (QFileDialogPrivate *this,QStringList *history,int splitterPosition)

{
  bool bVar1;
  QWidget *pQVar2;
  const_reference piVar3;
  reference piVar4;
  qsizetype qVar5;
  iterator iVar6;
  int *piVar7;
  const_reference ppQVar8;
  int in_EDX;
  QHeaderView *in_RSI;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int total;
  QAbstractItemModel *abstractModel;
  QHeaderView *headerView;
  int i;
  QFileDialog *q;
  QList<QAction_*> actions;
  QList<int> list;
  QList<int> splitterSizes;
  undefined4 in_stack_fffffffffffffec8;
  parameter_type in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  undefined1 uVar9;
  QWidget *in_stack_fffffffffffffed8;
  QByteArray *in_stack_fffffffffffffee0;
  QHeaderView *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  undefined4 in_stack_ffffffffffffff08;
  int iVar10;
  undefined4 in_stack_ffffffffffffff0c;
  int iVar11;
  QFileSystemModel *local_f0;
  const_iterator in_stack_ffffffffffffff20;
  int local_c4;
  bool local_9d;
  int local_9c;
  undefined1 local_98 [28];
  int local_7c;
  QList<QAction_*> local_78;
  QString *local_60;
  const_iterator local_58;
  const_iterator local_50;
  undefined8 local_48;
  QList<int> local_40;
  undefined8 local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_EDX < 0) {
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&in_RDI->qFileDialogUi);
    bVar1 = QSplitter::restoreState
                      ((QSplitter *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    if (!bVar1) {
      local_9d = false;
      goto LAB_0074fc12;
    }
    local_40.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_40.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_40.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&in_RDI->qFileDialogUi);
    QSplitter::sizes((QSplitter *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    qVar5 = QList<int>::size(&local_40);
    if (1 < qVar5) {
      piVar3 = QList<int>::at((QList<int> *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      if (*piVar3 != 0) {
        piVar3 = QList<int>::at((QList<int> *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        if (*piVar3 != 0) goto LAB_0074f99a;
      }
      local_c4 = 0;
      while( true ) {
        qVar5 = QList<int>::size(&local_40);
        if (qVar5 <= local_c4) break;
        QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                  (&in_RDI->qFileDialogUi);
        pQVar2 = QSplitter::widget((QSplitter *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4)
        ;
        local_48 = (**(code **)(*(long *)pQVar2 + 0x70))();
        in_stack_fffffffffffffef4 = QSize::width((QSize *)0x74f94c);
        piVar4 = QList<int>::operator[]
                           ((QList<int> *)
                            CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        *piVar4 = in_stack_fffffffffffffef4;
        local_c4 = local_c4 + 1;
      }
      QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                (&in_RDI->qFileDialogUi);
      QSplitter::setSizes((QSplitter *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                          ,(QList<int> *)
                           CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    }
LAB_0074f99a:
    QList<int>::~QList((QList<int> *)0x74f9a7);
  }
  else {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QList<int>::QList((QList<int> *)0x74f782);
    QList<int>::append((QList<int> *)0x74f796,in_stack_fffffffffffffecc);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&in_RDI->qFileDialogUi);
    pQVar2 = QSplitter::widget((QSplitter *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
    local_28 = (**(code **)(*(long *)pQVar2 + 0x70))();
    QSize::width((QSize *)0x74f7d3);
    QList<int>::append((QList<int> *)0x74f7e2,in_stack_fffffffffffffecc);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&in_RDI->qFileDialogUi);
    QSplitter::setSizes((QSplitter *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QList<int> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
    ;
    QList<int>::~QList((QList<int> *)0x74f811);
  }
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            (&in_RDI->qFileDialogUi);
  QSidebar::setUrls((QSidebar *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                    (QList<QUrl> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  qVar5 = QList<QString>::size((QList<QString> *)in_RSI);
  if (5 < qVar5) {
    iVar6 = QList<QString>::begin
                      ((QList<QString> *)
                       CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    QList<QString>::const_iterator::const_iterator(&local_50,iVar6);
    local_60 = (QString *)
               QList<QString>::end((QList<QString> *)
                                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    iVar6 = QList<QString>::iterator::operator-
                      ((iterator *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    QList<QString>::const_iterator::const_iterator(&local_58,iVar6);
    QList<QString>::erase
              ((QList<QString> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (const_iterator)iVar6.i,in_stack_ffffffffffffff20);
    in_stack_fffffffffffffee8 = in_RSI;
  }
  QFileDialog::setHistory
            ((QFileDialog *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (QStringList *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            (&in_RDI->qFileDialogUi);
  QTreeView::header((QTreeView *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  bVar1 = QHeaderView::restoreState
                    ((QHeaderView *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (QByteArray *)in_RDI);
  if (bVar1) {
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::actions(in_stack_fffffffffffffed8);
    local_f0 = in_RDI->model;
    if (in_RDI->proxyModel != (QAbstractProxyModel *)0x0) {
      local_f0 = (QFileSystemModel *)in_RDI->proxyModel;
    }
    QModelIndex::QModelIndex((QModelIndex *)0x74fb4f);
    local_7c = (**(code **)(*(long *)local_f0 + 0x80))(local_f0,local_98);
    qVar5 = QList<QAction_*>::size(&local_78);
    local_9c = (int)qVar5 + 1;
    piVar7 = qMin<int>(&local_7c,&local_9c);
    iVar11 = *piVar7;
    for (iVar10 = 1; iVar10 < iVar11; iVar10 = iVar10 + 1) {
      ppQVar8 = QList<QAction_*>::at
                          ((QList<QAction_*> *)
                           CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      uVar9 = SUB81(*ppQVar8,0);
      QHeaderView::isSectionHidden(in_stack_fffffffffffffee8,(int)((ulong)local_f0 >> 0x20));
      QAction::setChecked((bool)uVar9);
    }
    local_9d = true;
    QList<QAction_*>::~QList((QList<QAction_*> *)0x74fc12);
  }
  else {
    local_9d = false;
  }
LAB_0074fc12:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_9d;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDialogPrivate::restoreWidgetState(QStringList &history, int splitterPosition)
{
    Q_Q(QFileDialog);
    if (splitterPosition >= 0) {
        QList<int> splitterSizes;
        splitterSizes.append(splitterPosition);
        splitterSizes.append(qFileDialogUi->splitter->widget(1)->sizeHint().width());
        qFileDialogUi->splitter->setSizes(splitterSizes);
    } else {
        if (!qFileDialogUi->splitter->restoreState(splitterState))
            return false;
        QList<int> list = qFileDialogUi->splitter->sizes();
        if (list.size() >= 2 && (list.at(0) == 0 || list.at(1) == 0)) {
            for (int i = 0; i < list.size(); ++i)
                list[i] = qFileDialogUi->splitter->widget(i)->sizeHint().width();
            qFileDialogUi->splitter->setSizes(list);
        }
    }

    qFileDialogUi->sidebar->setUrls(sidebarUrls);

    static const int MaxHistorySize = 5;
    if (history.size() > MaxHistorySize)
        history.erase(history.begin(), history.end() - MaxHistorySize);
    q->setHistory(history);

    QHeaderView *headerView = qFileDialogUi->treeView->header();
    if (!headerView->restoreState(headerData))
        return false;

    QList<QAction*> actions = headerView->actions();
    QAbstractItemModel *abstractModel = model;
#if QT_CONFIG(proxymodel)
    if (proxyModel)
        abstractModel = proxyModel;
#endif
    const int total = qMin(abstractModel->columnCount(QModelIndex()), int(actions.size() + 1));
    for (int i = 1; i < total; ++i)
        actions.at(i - 1)->setChecked(!headerView->isSectionHidden(i));

    return true;
}